

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

prod_bitset * __thiscall
CppGenerator::computeDependentLoops
          (CppGenerator *this,size_t view_id,prod_bitset presentFunctions,var_bitset relationBag,
          dyn_bitset *contributingViews,var_bitset varOrderBitset,dyn_bitset *addedOutLoops,
          size_t thisLoopID)

{
  var_bitset relationBag_00;
  var_bitset relationBag_01;
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  size_t sVar4;
  ostream *poVar5;
  _WordT in_RCX;
  long lVar6;
  CppGenerator *in_RDX;
  _WordT in_RSI;
  undefined8 *puVar7;
  prod_bitset *in_RDI;
  undefined8 *puVar8;
  size_t in_R9;
  byte bVar9;
  reference rVar10;
  _Base_bitset<24UL> in_stack_00000000;
  undefined1 in_stack_000000c0 [16];
  dyn_bitset *in_stack_000000d0;
  size_t in_stack_000000d8;
  size_type in_stack_000000e0;
  prod_bitset branch_1;
  DependentLoop newDepLoop_1;
  size_t *potNextLoop_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  size_t nextLoopID_1;
  bool found_1;
  dyn_bitset nextConsideredLoops_1;
  size_t nextOutLoop;
  prod_bitset branch;
  DependentLoop newDepLoop;
  size_t *potNextLoop;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  size_t nextLoopID;
  bool found;
  dyn_bitset nextConsideredLoops;
  size_t viewID;
  DependentLoop *depLoop;
  size_t next;
  dyn_bitset remainingLoops;
  var_bitset *incViewBitset;
  View *incView;
  size_t incID;
  size_t v;
  var_bitset *functionVars;
  size_t f;
  dyn_bitset nonAddedOutLoops;
  size_t view;
  size_t highestPosition;
  dyn_bitset *consideredLoops;
  prod_bitset loopFunctionMask;
  dyn_bitset nextLoops;
  dyn_bitset loopFactors;
  value_type *in_stack_fffffffffffff218;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  value_type *in_stack_fffffffffffff228;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff230;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff238;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff240;
  size_t in_stack_fffffffffffff248;
  DependentLoop *in_stack_fffffffffffff250;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff258;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff260;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff268;
  bitset<1500UL> *in_stack_fffffffffffff2e0;
  bool local_c45;
  bool local_c43;
  byte local_c02;
  undefined8 local_b18 [62];
  size_type local_928;
  reference local_860;
  unsigned_long *local_858;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_850;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_848;
  unsigned_long local_840;
  byte local_831;
  size_type local_810;
  _WordT local_7e8;
  undefined8 local_7a8 [62];
  ulong local_5b8;
  reference local_4f0;
  unsigned_long *local_4e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_4d8;
  unsigned_long local_4d0;
  byte local_4c1;
  reference local_4c0 [3];
  reference local_490;
  ulong local_480;
  reference local_3b0;
  size_type local_2e8;
  byte local_27a;
  byte local_279;
  var_bitset *local_218;
  View *local_210;
  reference local_208;
  ulong local_1f8;
  reference local_1f0;
  byte local_1d9;
  reference local_1d8;
  ulong local_1c8;
  Function *local_1c0;
  reference local_1b8;
  ulong local_1a8;
  size_t local_160;
  size_t local_158;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_150;
  dyn_bitset *in_stack_ffffffffffffffd0;
  _WordT _Var11;
  
  bVar9 = 0;
  _Var11 = in_RSI;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2c7f88);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2c7f90);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2c7fb0);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffff240,(size_type)in_stack_fffffffffffff238,
             (unsigned_long)in_stack_fffffffffffff230,
             (allocator<unsigned_long> *)in_stack_fffffffffffff228);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2c7fe0);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2c7ff1);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2c7ff9);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2c802b);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffff240,(size_type)in_stack_fffffffffffff238,
             (unsigned_long)in_stack_fffffffffffff230,
             (allocator<unsigned_long> *)in_stack_fffffffffffff228);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2c805b);
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2c8068);
  pvVar3 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                     ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8),
                      in_stack_000000e0);
  local_150 = &pvVar3->loopFactors;
  local_158 = 0;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2c80ad);
  local_160 = QueryCompiler::numberOfViews((QueryCompiler *)0x2c80b5);
  do {
    if (local_160 == 0) {
LAB_002c81ba:
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RSI + 0x5e0),(size_type)in_RDX);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (in_stack_fffffffffffff238);
      boost::operator&(in_stack_fffffffffffff268,in_stack_fffffffffffff260);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c8221);
      local_1a8 = 0;
      do {
        if (0x5db < local_1a8) {
          std::bitset<1500UL>::operator~(in_stack_fffffffffffff2e0);
          std::bitset<1500UL>::operator&=
                    ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220)
                     ,(bitset<1500UL> *)in_stack_fffffffffffff218);
          local_3b0 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                                ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                                 (in_RSI + 0x5c8),in_stack_000000e0);
          bVar2 = std::bitset<1500UL>::any((bitset<1500UL> *)0x2c8ad9);
          if (bVar2) {
            std::pair<unsigned_long,_std::bitset<1500UL>_>::
            pair<unsigned_long_&,_std::bitset<1500UL>_&,_true>
                      ((pair<unsigned_long,_std::bitset<1500UL>_> *)
                       CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                       &in_stack_fffffffffffff218->first,(bitset<1500UL> *)0x2c8b0c);
            std::
            vector<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ::push_back((vector<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                        in_stack_fffffffffffff218);
          }
          local_480 = 0;
          do {
            uVar1 = local_480;
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2c8b54);
            sVar4 = QueryCompiler::numberOfViews((QueryCompiler *)0x2c8b5c);
            if (sVar4 + 1 <= uVar1) {
              std::
              vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(in_RSI + 0x5e0),(size_type)in_RDX);
              bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),
                                        (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)in_stack_fffffffffffff218);
              if (bVar2) {
                std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                          ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8)
                           ,in_stack_000000e0);
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                          (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                           (bool)in_stack_fffffffffffff227);
              }
              bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),
                                        (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)in_stack_fffffffffffff218);
              if (bVar2) {
                bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff228);
                if (bVar2) {
                  local_810 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                              find_first((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                          *)0x2c9198);
                  if (local_810 != 0xffffffffffffffff) {
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff218);
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                              (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                               (bool)in_stack_fffffffffffff227);
                    local_831 = 0;
                    local_848 = &local_3b0->next;
                    local_850._M_current =
                         (unsigned_long *)
                         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    in_stack_fffffffffffff218);
                    local_858 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_fffffffffffff218);
                    while( true ) {
                      bVar2 = __gnu_cxx::operator!=
                                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff227,
                                                     in_stack_fffffffffffff220),
                                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                          *)in_stack_fffffffffffff218);
                      if (!bVar2) break;
                      local_860 = __gnu_cxx::
                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  ::operator*(&local_850);
                      std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                                ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                                 (in_RSI + 0x5c8),*local_860);
                      bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)CONCAT17(in_stack_fffffffffffff227,
                                                            in_stack_fffffffffffff220),
                                                (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_fffffffffffff218);
                      if (bVar2) {
                        local_831 = 1;
                        local_840 = *local_860;
                      }
                      __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++(&local_850);
                    }
                    if ((local_831 & 1) == 0) {
                      local_840 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                                            ((vector<DependentLoop,_std::allocator<DependentLoop>_>
                                              *)(in_RSI + 0x5c8));
                      std::
                      __shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2c933b);
                      QueryCompiler::numberOfViews((QueryCompiler *)0x2c9343);
                      DependentLoop::DependentLoop
                                (in_stack_fffffffffffff250,in_stack_fffffffffffff248);
                      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                      operator=((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                                (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                in_stack_fffffffffffff218);
                      local_928 = local_810;
                      std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
                                ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                                 in_stack_fffffffffffff230,in_stack_fffffffffffff228);
                      std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                                ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                                 (in_RSI + 0x5c8),in_stack_000000e0);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                                (&in_stack_fffffffffffff230->m_bits,
                                 (value_type_conflict2 *)in_stack_fffffffffffff228);
                      DependentLoop::~DependentLoop
                                ((DependentLoop *)
                                 CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
                    }
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                              (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                               (bool)in_stack_fffffffffffff227);
                    memcpy(local_b18,&stack0x00000008,0xc0);
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff218);
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff218);
                    puVar7 = local_b18;
                    puVar8 = (undefined8 *)&stack0xfffffffffffff218;
                    for (lVar6 = 0x18; lVar6 != 0; lVar6 = lVar6 + -1) {
                      *puVar8 = *puVar7;
                      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
                      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
                    }
                    relationBag_01.super__Base_bitset<2UL>._M_w[1] = in_RCX;
                    relationBag_01.super__Base_bitset<2UL>._M_w[0] = _Var11;
                    computeDependentLoops
                              (in_RDX,in_R9,(prod_bitset)in_stack_00000000._M_w,relationBag_01,
                               in_stack_ffffffffffffffd0,(var_bitset)in_stack_000000c0,
                               in_stack_000000d0,in_stack_000000d8);
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    ~dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
                                    )0x2c954e);
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    ~dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
                                    )0x2c955b);
                    std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                              ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                               (in_RSI + 0x5c8),in_stack_000000e0);
                    std::bitset<1500UL>::operator|=
                              ((bitset<1500UL> *)
                               CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                               (bitset<1500UL> *)in_stack_fffffffffffff218);
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    ~dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
                                    )0x2c9598);
                  }
                }
              }
              pvVar3 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                                 ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                                  (in_RSI + 0x5c8),in_stack_000000e0);
              memcpy(in_RDI,&pvVar3->branchFunctions,0xc0);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c9631);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c963e);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c964b);
              return in_RDI;
            }
            rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                     operator[](in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228);
            local_490 = rVar10;
            bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_490)
            ;
            if (bVar2) {
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff218);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                        (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                         (bool)in_stack_fffffffffffff227);
              std::
              vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(in_RSI + 0x5e0),(size_type)in_RDX);
              rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                       operator[](in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228);
              local_4c0[0] = rVar10;
              bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool
                                ((reference *)local_4c0);
              if (bVar2) {
                std::operator<<((ostream *)&std::cerr,
                                "THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
                exit(1);
              }
              local_4c1 = 0;
              local_4d8 = &local_3b0->next;
              local_4e0._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffff218);
              local_4e8 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffff218);
              while( true ) {
                bVar2 = __gnu_cxx::operator!=
                                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffff218);
                if (!bVar2) break;
                local_4f0 = __gnu_cxx::
                            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ::operator*(&local_4e0);
                std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                          ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8)
                           ,*local_4f0);
                bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                           *)CONCAT17(in_stack_fffffffffffff227,
                                                      in_stack_fffffffffffff220),
                                          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                           *)in_stack_fffffffffffff218);
                if (bVar2) {
                  local_4c1 = 1;
                  local_4d0 = *local_4f0;
                }
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_4e0);
              }
              if ((local_4c1 & 1) == 0) {
                local_4d0 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                                      ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                                       (in_RSI + 0x5c8));
                std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2c8e08);
                QueryCompiler::numberOfViews((QueryCompiler *)0x2c8e10);
                DependentLoop::DependentLoop(in_stack_fffffffffffff250,in_stack_fffffffffffff248);
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff218);
                local_5b8 = local_480;
                std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
                          ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                           in_stack_fffffffffffff230,in_stack_fffffffffffff228);
                std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                          ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8)
                           ,in_stack_000000e0);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&in_stack_fffffffffffff230->m_bits,
                           (value_type_conflict2 *)in_stack_fffffffffffff228);
                DependentLoop::~DependentLoop
                          ((DependentLoop *)
                           CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
              }
              memcpy(local_7a8,&stack0x00000008,0xc0);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff218);
              local_7e8 = in_stack_000000c0._8_8_;
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff218);
              puVar7 = local_7a8;
              puVar8 = (undefined8 *)&stack0xfffffffffffff218;
              for (lVar6 = 0x18; lVar6 != 0; lVar6 = lVar6 + -1) {
                *puVar8 = *puVar7;
                puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
                puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
              }
              relationBag_00.super__Base_bitset<2UL>._M_w[1] = in_RCX;
              relationBag_00.super__Base_bitset<2UL>._M_w[0] = _Var11;
              computeDependentLoops
                        (in_RDX,in_R9,(prod_bitset)in_stack_00000000._M_w,relationBag_00,
                         in_stack_ffffffffffffffd0,(var_bitset)in_stack_000000c0,in_stack_000000d0,
                         in_stack_000000d8);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c8fff);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c900c);
              std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                        ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8),
                         in_stack_000000e0);
              std::bitset<1500UL>::operator|=
                        ((bitset<1500UL> *)
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                         (bitset<1500UL> *)in_stack_fffffffffffff218);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c9049);
            }
            local_480 = local_480 + 1;
          } while( true );
        }
        std::bitset<1500UL>::operator[]
                  ((bitset<1500UL> *)in_stack_fffffffffffff228,
                   CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)
                           CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
        std::bitset<1500UL>::reference::~reference(&local_1b8);
        if (bVar2) {
          std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x2c82a0);
          local_1c0 = QueryCompiler::getFunction
                                ((QueryCompiler *)
                                 CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                                 (size_t)in_stack_fffffffffffff218);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                    (in_stack_fffffffffffff230);
          for (local_1c8 = 0; local_1c8 < 100; local_1c8 = local_1c8 + 1) {
            local_1d9 = 0;
            bVar2 = std::bitset<100UL>::operator[]
                              ((bitset<100UL> *)
                               CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                               (size_t)in_stack_fffffffffffff218);
            local_c02 = 0;
            if (bVar2) {
              std::bitset<100UL>::operator[]
                        ((bitset<100UL> *)in_stack_fffffffffffff228,
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
              local_1d9 = 1;
              bVar2 = std::bitset::reference::operator_cast_to_bool
                                ((reference *)
                                 CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
              local_c02 = bVar2 ^ 0xff;
            }
            if ((local_1d9 & 1) != 0) {
              std::bitset<100UL>::reference::~reference(&local_1d8);
            }
            if ((local_c02 & 1) != 0) {
              std::bitset<100UL>::operator[]
                        ((bitset<100UL> *)in_stack_fffffffffffff228,
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
              bVar2 = std::bitset::reference::operator_cast_to_bool
                                ((reference *)
                                 CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
              std::bitset<100UL>::reference::~reference(&local_1f0);
              if (bVar2) {
                std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2c8406);
                QueryCompiler::numberOfViews((QueryCompiler *)0x2c840e);
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                          (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                           (bool)in_stack_fffffffffffff227);
              }
              else {
                local_1f8 = 0;
                while( true ) {
                  uVar1 = local_1f8;
                  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2c84a5);
                  sVar4 = QueryCompiler::numberOfViews((QueryCompiler *)0x2c84ad);
                  if (sVar4 <= uVar1) break;
                  rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                           operator[](in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228
                                     );
                  local_208 = rVar10;
                  bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool
                                    ((reference *)&local_208);
                  if (bVar2) {
                    std::
                    __shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2c854e);
                    local_210 = QueryCompiler::getView
                                          ((QueryCompiler *)
                                           CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),
                                           (size_t)in_stack_fffffffffffff218);
                    local_218 = &local_210->_fVars;
                    bVar2 = std::bitset<100UL>::operator[]
                                      ((bitset<100UL> *)
                                       CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220)
                                       ,(size_t)in_stack_fffffffffffff218);
                    if (bVar2) {
                      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                                (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                                 (bool)in_stack_fffffffffffff227);
                      break;
                    }
                  }
                  local_1f8 = local_1f8 + 1;
                }
              }
            }
          }
          local_279 = 0;
          local_27a = 0;
          boost::operator&(in_stack_fffffffffffff268,in_stack_fffffffffffff260);
          bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffff228);
          local_c43 = true;
          if (!bVar2) {
            bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff228);
            local_c45 = false;
            if (bVar2) {
              std::
              vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(in_RSI + 0x5e0),(size_type)in_RDX);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                        (in_stack_fffffffffffff238);
              local_279 = 1;
              boost::operator&(in_stack_fffffffffffff268,in_stack_fffffffffffff260);
              local_27a = 1;
              local_c45 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)in_stack_fffffffffffff228);
            }
            local_c43 = local_c45;
          }
          if ((local_27a & 1) != 0) {
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c8759);
          }
          if ((local_279 & 1) != 0) {
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c8772);
          }
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c877f);
          if (local_c43 == false) {
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
                      (in_stack_fffffffffffff240,in_stack_fffffffffffff238);
            bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                       *)CONCAT17(in_stack_fffffffffffff227,
                                                  in_stack_fffffffffffff220),
                                      (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                       *)in_stack_fffffffffffff218);
            if (bVar2) {
              std::bitset<1500UL>::set
                        ((bitset<1500UL> *)in_stack_fffffffffffff230,
                         (size_t)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
            }
            else {
              boost::operator&(in_stack_fffffffffffff268,in_stack_fffffffffffff260);
              bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),
                                        (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)in_stack_fffffffffffff218);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c88c9);
              if (bVar2) {
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                          (in_stack_fffffffffffff238);
                boost::operator&(in_stack_fffffffffffff268,in_stack_fffffffffffff260);
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                ~dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                0x2c891c);
                bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff228);
                if (bVar2) {
                  local_2e8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                              find_next(in_stack_fffffffffffff258,
                                        (size_type)in_stack_fffffffffffff250);
                  if (local_2e8 == 0xffffffffffffffff) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "We found a remaining Loop which is not higher ");
                    std::operator<<(poVar5," than the highest considered loop?!\n");
                    exit(1);
                  }
                  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                            (in_stack_fffffffffffff230,(size_type)in_stack_fffffffffffff228,
                             (bool)in_stack_fffffffffffff227);
                }
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                ~dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                0x2c8a5f);
              }
            }
          }
        }
        local_1a8 = local_1a8 + 1;
      } while( true );
    }
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                       (size_type)in_stack_fffffffffffff218);
    if (bVar2) {
      local_158 = local_160;
      goto LAB_002c81ba;
    }
    local_160 = local_160 - 1;
  } while( true );
}

Assistant:

prod_bitset CppGenerator::computeDependentLoops(
    size_t view_id, prod_bitset presentFunctions, var_bitset relationBag,
    dyn_bitset contributingViews, var_bitset varOrderBitset,
    dyn_bitset addedOutLoops, size_t thisLoopID)
{
    dyn_bitset loopFactors(_qc->numberOfViews()+1);
    dyn_bitset nextLoops(_qc->numberOfViews()+1);

    prod_bitset loopFunctionMask;

    const dyn_bitset& consideredLoops = depListOfLoops[thisLoopID].loopFactors;

    size_t highestPosition = 0;
    // need to continue with this the next loop
    for (size_t view=_qc->numberOfViews(); view > 0; view--)
    {
        if (consideredLoops[view])
        {
            highestPosition = view;
            break;
        }
    }

    
    dyn_bitset nonAddedOutLoops = outViewLoop[view_id] & ~addedOutLoops;

    // then find all loops required to compute these functions and create masks
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (presentFunctions[f])
        {
            const var_bitset& functionVars = _qc->getFunction(f)->_fVars;
            loopFactors.reset();
            
            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {
                if (functionVars[v] && !varOrderBitset[v])
                {
                    if (relationBag[v])
                        loopFactors.set(_qc->numberOfViews());
                    else
                    {
                        for (size_t incID = 0; incID < _qc->numberOfViews(); ++incID)
                        {
                            if (contributingViews[incID])
                            {
                                View* incView = _qc->getView(incID);
                                const var_bitset& incViewBitset = incView->_fVars;
                                if (incViewBitset[v])
                                {
                                    loopFactors.set(incID);
                                    break;
                                }
                            }
                        }
                    }
                }
            }

            // TODO: TODO: Consider this again 
            if ((loopFactors & nonAddedOutLoops).any() ||
                (nonAddedOutLoops.any() && (loopFactors & ~outViewLoop[view_id]).any()))
                continue;
            
            loopFactors |= addedOutLoops;
            
            if (loopFactors == consideredLoops)
            {
                // Add this function to the mask for this loop
                loopFunctionMask.set(f);
            }
            else
            {
                if ((consideredLoops & loopFactors) == consideredLoops)
                {
                    dyn_bitset remainingLoops = loopFactors & ~consideredLoops;
                    if (remainingLoops.any())
                    {
                        size_t next = remainingLoops.find_next(highestPosition);
                        if (next != boost::dynamic_bitset<>::npos)
                            nextLoops.set(next);
                        else
                        {
                            ERROR("We found a remaining Loop which is not higher " <<
                                  " than the highest considered loop?!\n");
                            exit(1);
                        }
                    }
                }
            }
        }
    }
    
    presentFunctions &= ~loopFunctionMask;
    
    // Then use the registrar to split the functions to their loops
    DependentLoop& depLoop = depListOfLoops[thisLoopID];
    if (loopFunctionMask.any())
        depLoop.functionMask.push_back({view_id, loopFunctionMask});
    
    // Recurse to the next loops
    for (size_t viewID=0; viewID < _qc->numberOfViews() + 1; ++viewID)
    {
        if (nextLoops[viewID])
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(viewID);

            if (outViewLoop[view_id][viewID])
            {
                ERROR("THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
                exit(1);
            }

            // TODO: check the next loops for the given DependentLoop
            // if any of them use the same loop -- then reuse this one

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = viewID;

                // std::cout << "#########" << newDepLoop.loopFactors << std::endl;
                
                depListOfLoops.push_back(newDepLoop);

                // std::cout << depLoop.next.size() << std::endl;
                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            prod_bitset branch =
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews, varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }

    if (outViewLoop[view_id] == consideredLoops)
        depListOfLoops[thisLoopID].outView.set(view_id);

    if (consideredLoops == addedOutLoops && nonAddedOutLoops.any())
    {
        size_t nextOutLoop = nonAddedOutLoops.find_first();
        if (nextOutLoop != boost::dynamic_bitset<>::npos)
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(nextOutLoop);

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = nextOutLoop;
                
                
                depListOfLoops.push_back(newDepLoop);

                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            addedOutLoops.set(nextOutLoop);

            prod_bitset branch =                
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews,varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }
    
    return depListOfLoops[thisLoopID].branchFunctions;
}